

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

string * __thiscall
QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  string *__return_storage_ptr___00;
  bool bVar1;
  QPDFObjGen og;
  QPDFObjectHandle node;
  set seen;
  allocator<char> local_e1;
  QPDFObjectHandle local_e0;
  undefined1 local_d0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_80;
  string local_50 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_d0,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_QPDFObjectHelper).super_BaseHandle);
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr___00 = (string *)(local_d0 + 0x10);
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_d0);
    if (bVar1) break;
    og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_d0);
    bVar1 = QPDFObjGen::set::add((set *)&local_80,og);
    if (!bVar1) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"/T",(allocator<char> *)local_50);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)__return_storage_ptr___00,(string *)local_d0);
    bVar1 = QPDFObjectHandle::isString((QPDFObjectHandle *)__return_storage_ptr___00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b8);
    std::__cxx11::string::~string((string *)&local_a0);
    if (bVar1) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::operator+(&local_a0,".",__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      std::__cxx11::string::string<std::allocator<char>>(local_50,"/T",&local_e1);
      QPDFObjectHandle::getKey(&local_e0,(string *)local_d0);
      QPDFObjectHandle::getUTF8Value_abi_cxx11_(__return_storage_ptr___00,&local_e0);
      std::operator+(&local_a0,__return_storage_ptr___00,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)__return_storage_ptr___00);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_e0.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string(local_50);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"/Parent",(allocator<char> *)local_50);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)__return_storage_ptr___00,(string *)local_d0);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_d0,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr___00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_b8);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getFullyQualifiedName()
{
    std::string result;
    QPDFObjectHandle node = oh();
    QPDFObjGen::set seen;
    while (!node.isNull() && seen.add(node)) {
        if (node.getKey("/T").isString()) {
            if (!result.empty()) {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper non-trivial qualified name");
                result = "." + result;
            }
            result = node.getKey("/T").getUTF8Value() + result;
        }
        node = node.getKey("/Parent");
    }
    return result;
}